

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_meshb(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_GEOM pRVar2;
  REF_INT id_00;
  uint uVar3;
  REF_STATUS RVar4;
  int iVar5;
  FILE *__stream;
  size_t sVar6;
  long lVar7;
  REF_BYTE *__ptr;
  undefined8 uVar8;
  REF_CELL global;
  char *pcVar9;
  size_t __size;
  uint node;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  REF_INT *value;
  REF_DBL *__ptr_00;
  undefined4 uVar13;
  undefined4 uVar14;
  REF_BOOL available;
  REF_INT new_node;
  REF_FILEPOS next_position;
  REF_INT id;
  REF_INT new_geom;
  REF_INT ngeom;
  REF_INT ncell;
  REF_INT nnode;
  REF_INT keyword_code;
  REF_INT dim;
  REF_INT version;
  double double_gref;
  REF_INT new_cell;
  REF_DBL param [2];
  REF_FILEPOS key_pos [156];
  int local_614;
  int local_610;
  uint local_60c;
  REF_CELL local_608;
  REF_CELL local_600;
  size_t local_5f8;
  uint local_5ec;
  REF_GEOM local_5e8;
  REF_INT local_5dc;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  REF_INT local_5c4;
  uint local_5c0;
  REF_INT local_5bc;
  ulong local_5b8;
  long local_5b0;
  double local_5a8;
  REF_INT local_59c;
  REF_DBL local_598 [2];
  REF_INT local_588;
  undefined1 local_584 [16];
  REF_FILEPOS local_518 [157];
  
  uVar3 = ref_import_meshb_header(filename,&local_5bc,local_518);
  if (uVar3 == 0) {
    uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
    if (uVar3 == 0) {
      pRVar1 = *ref_grid_ptr;
      ref_node = pRVar1->node;
      pRVar2 = pRVar1->geom;
      __stream = fopen(filename,"r");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar9 = "unable to open file";
        uVar8 = 0x61e;
LAB_001f4c02:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar8,"ref_import_meshb",pcVar9);
        return 2;
      }
      local_5e8 = pRVar2;
      uVar3 = ref_import_meshb_jump
                        ((FILE *)__stream,local_5bc,local_518,3,&local_614,(REF_FILEPOS *)&local_5f8
                        );
      if (uVar3 == 0) {
        if (local_614 == 0) {
          pcVar9 = "meshb missing dimension";
          uVar8 = 0x623;
        }
        else {
          sVar6 = fread(&local_5c0,4,1,__stream);
          if (sVar6 != 1) {
            pcVar9 = "dim";
            __size = 1;
            uVar8 = 0x624;
            goto LAB_001f4cd3;
          }
          if (0xfffffffd < local_5c0 - 4) {
            if (local_5c0 == 2) {
              pRVar1->twod = 1;
            }
            uVar3 = ref_import_meshb_jump
                              ((FILE *)__stream,local_5bc,local_518,4,&local_614,
                               (REF_FILEPOS *)&local_5f8);
            if (uVar3 == 0) {
              if (local_614 == 0) {
                pcVar9 = "meshb missing vertex";
                uVar8 = 0x62f;
                goto LAB_001f4c9f;
              }
              uVar3 = ref_import_meshb_int((FILE *)__stream,local_5bc,&local_5c8);
              if (uVar3 != 0) {
                pcVar9 = "nnode";
                uVar8 = 0x630;
LAB_001f4d7f:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,uVar8,"ref_import_meshb",(ulong)uVar3,pcVar9);
                return 1;
              }
              local_608 = (REF_CELL)(long)local_5c8;
              if ((long)local_608 < 1) {
                uVar3 = 0;
              }
              else {
                global = (REF_CELL)0x0;
                do {
                  local_600 = global;
                  uVar3 = ref_node_add(ref_node,(REF_GLOB)global,&local_610);
                  if (uVar3 != 0) {
                    pcVar9 = "add node";
                    uVar8 = 0x634;
                    goto LAB_001f4b35;
                  }
                  uVar3 = meshb_real((FILE *)__stream,local_5bc,
                                     ref_node->real + (long)local_610 * 0xf);
                  if (local_5c0 == 2) {
                    if (uVar3 != 0) {
                      pcVar9 = "x";
                      uVar8 = 0x637;
                      goto LAB_001f541c;
                    }
                    RVar4 = meshb_real((FILE *)__stream,local_5bc,
                                       ref_node->real + (long)local_610 * 0xf + 1);
                    if (RVar4 != 0) {
                      pcVar9 = "y";
                      uVar8 = 0x639;
                      goto LAB_001f541c;
                    }
                    ref_node->real[(long)local_610 * 0xf + 2] = 0.0;
                  }
                  else {
                    if (uVar3 != 0) {
                      pcVar9 = "x";
                      uVar8 = 0x63d;
                      goto LAB_001f4d7f;
                    }
                    RVar4 = meshb_real((FILE *)__stream,local_5bc,
                                       ref_node->real + (long)local_610 * 0xf + 1);
                    if (RVar4 != 0) {
                      pcVar9 = "y";
                      uVar8 = 0x63f;
                      goto LAB_001f541c;
                    }
                    RVar4 = meshb_real((FILE *)__stream,local_5bc,
                                       ref_node->real + (long)local_610 * 0xf + 2);
                    if (RVar4 != 0) {
                      pcVar9 = "z";
                      uVar8 = 0x641;
                      goto LAB_001f541c;
                    }
                  }
                  RVar4 = ref_import_meshb_int((FILE *)__stream,local_5bc,&local_5dc);
                  if (RVar4 != 0) {
                    pcVar9 = "nnode";
                    uVar8 = 0x643;
                    goto LAB_001f541c;
                  }
                  global = (REF_CELL)((long)&local_600->type + 1);
                } while (local_608 != global);
                uVar3 = (uint)local_608;
              }
              __size = local_5f8;
              sVar6 = ftello(__stream);
              if (__size != sVar6) {
                pcVar9 = "end location";
                uVar8 = 0x645;
                goto LAB_001f4cd3;
              }
              local_60c = uVar3;
              uVar3 = ref_node_initialize_n_global(ref_node,(REF_GLOB)local_608);
              if (uVar3 == 0) {
                lVar7 = 0;
                do {
                  local_600 = pRVar1->cell[lVar7];
                  local_5b0 = lVar7;
                  uVar3 = ref_cell_meshb_keyword(local_600,&local_5c4);
                  if (uVar3 != 0) {
                    pcVar9 = "kw";
                    uVar8 = 0x64a;
                    goto LAB_001f4b35;
                  }
                  uVar3 = ref_import_meshb_jump
                                    ((FILE *)__stream,local_5bc,local_518,local_5c4,&local_614,
                                     (REF_FILEPOS *)&local_5f8);
                  if (uVar3 != 0) {
                    pcVar9 = "jump";
                    uVar8 = 0x64d;
                    goto LAB_001f4b35;
                  }
                  if (local_614 != 0) {
                    uVar12 = local_600->node_per;
                    RVar4 = ref_import_meshb_int((FILE *)__stream,local_5bc,&local_5cc);
                    if (RVar4 != 0) {
                      pcVar9 = "ncell";
                      uVar8 = 0x650;
                      goto LAB_001f541c;
                    }
                    local_5d8 = local_5cc;
                    if (0 < local_5cc) {
                      local_5b8 = (ulong)(uVar12 + 1);
                      local_608 = (REF_CELL)((ulong)local_608 & 0xffffffff00000000);
                      do {
                        local_60c = 0;
                        if (-1 < (int)uVar12) {
                          value = &local_588;
                          uVar10 = local_5b8;
                          do {
                            RVar4 = ref_import_meshb_int((FILE *)__stream,local_5bc,value);
                            if (RVar4 != 0) {
                              pcVar9 = "c2n";
                              uVar8 = 0x654;
                              goto LAB_001f541c;
                            }
                            value = value + 1;
                            uVar10 = uVar10 - 1;
                          } while (uVar10 != 0);
                          local_60c = 0;
                          if (0 < (int)uVar12) {
                            uVar10 = 0;
                            do {
                              *(int *)(local_584 + uVar10 * 4 + -4) =
                                   *(int *)(local_584 + uVar10 * 4 + -4) + -1;
                              uVar10 = uVar10 + 1;
                              local_60c = uVar12;
                            } while (uVar12 != uVar10);
                          }
                        }
                        if (local_600->type == REF_CELL_PYR) {
                          uVar13 = local_584._0_4_;
                          uVar14 = local_584._4_4_;
                          local_584._0_8_ = local_584._8_8_;
                          local_584._8_4_ = uVar13;
                          local_584._12_4_ = uVar14;
                        }
                        uVar3 = ref_cell_add(local_600,&local_588,&local_59c);
                        if (uVar3 != 0) {
                          pcVar9 = "add cell";
                          uVar8 = 0x667;
                          goto LAB_001f4b35;
                        }
                        iVar5 = (int)local_608 + 1;
                        local_608 = (REF_CELL)CONCAT44(local_608._4_4_,iVar5);
                      } while (iVar5 != local_5d8);
                    }
                    __size = local_5f8;
                    sVar6 = ftell(__stream);
                    if (__size != sVar6) {
                      pcVar9 = "cell inconsistent";
                      uVar8 = 0x669;
                      goto LAB_001f4cd3;
                    }
                  }
                  lVar7 = local_5b0 + 1;
                } while (lVar7 != 0x10);
                local_5ec = local_60c;
                lVar7 = 0;
                do {
                  uVar12 = (uint)lVar7;
                  uVar3 = ref_import_meshb_jump
                                    ((FILE *)__stream,local_5bc,local_518,uVar12 | 0x28,&local_614,
                                     (REF_FILEPOS *)&local_5f8);
                  if (uVar3 != 0) {
                    pcVar9 = "jump";
                    uVar8 = 0x671;
                    goto LAB_001f4b35;
                  }
                  if (local_614 != 0) {
                    RVar4 = ref_import_meshb_int((FILE *)__stream,local_5bc,&local_5d0);
                    if (RVar4 != 0) {
                      pcVar9 = "ngeom";
                      uVar8 = 0x673;
LAB_001f541c:
                      uVar3 = 1;
                      uVar10 = 1;
                      goto LAB_001f4b38;
                    }
                    local_608 = (REF_CELL)CONCAT44(local_608._4_4_,local_5d0);
                    if (0 < local_5d0) {
                      local_600 = (REF_CELL)((ulong)local_600 & 0xffffffff00000000);
                      do {
                        RVar4 = ref_import_meshb_int
                                          ((FILE *)__stream,local_5bc,(REF_INT *)&local_5ec);
                        if (RVar4 != 0) {
                          pcVar9 = "node";
                          uVar8 = 0x677;
                          goto LAB_001f541c;
                        }
                        RVar4 = ref_import_meshb_int((FILE *)__stream,local_5bc,&local_5dc);
                        if (RVar4 != 0) {
                          pcVar9 = "node";
                          uVar8 = 0x678;
                          goto LAB_001f541c;
                        }
                        if (lVar7 != 0) {
                          __ptr_00 = local_598;
                          lVar11 = lVar7;
                          do {
                            sVar6 = fread(__ptr_00,8,1,__stream);
                            if (sVar6 != 1) {
                              pcVar9 = "param";
                              __size = 1;
                              uVar8 = 0x67a;
                              goto LAB_001f4cd3;
                            }
                            __ptr_00 = __ptr_00 + 1;
                            lVar11 = lVar11 + -1;
                          } while (lVar11 != 0);
                        }
                        id_00 = local_5dc;
                        node = local_5ec - 1;
                        local_5ec = node;
                        uVar3 = ref_geom_add(local_5e8,node,uVar12,local_5dc,local_598);
                        if (uVar3 != 0) {
                          pcVar9 = "add geom";
                          uVar8 = 0x67c;
                          goto LAB_001f4b35;
                        }
                        if (lVar7 != 0) {
                          sVar6 = fread(&local_5a8,8,1,__stream);
                          if (sVar6 != 1) {
                            pcVar9 = "gref";
                            __size = 1;
                            uVar8 = 0x680;
                            goto LAB_001f4cd3;
                          }
                          uVar3 = ref_geom_find(local_5e8,node,uVar12,id_00,&local_5d4);
                          if (uVar3 != 0) {
                            pcVar9 = "find";
                            uVar8 = 0x681;
                            goto LAB_001f4b35;
                          }
                          local_5e8->descr[(long)local_5d4 * 6 + 2] = (int)local_5a8;
                        }
                        iVar5 = (int)local_600 + 1;
                        local_600 = (REF_CELL)CONCAT44(local_600._4_4_,iVar5);
                      } while (iVar5 != (int)local_608);
                    }
                    __size = local_5f8;
                    sVar6 = ftello(__stream);
                    if (__size != sVar6) {
                      pcVar9 = "end location";
                      uVar8 = 0x685;
                      goto LAB_001f4cd3;
                    }
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 3);
                uVar3 = ref_import_meshb_jump
                                  ((FILE *)__stream,local_5bc,local_518,0x7e,&local_614,
                                   (REF_FILEPOS *)&local_5f8);
                if (uVar3 == 0) {
                  if (local_614 != 0) {
                    uVar3 = ref_import_meshb_size
                                      ((FILE *)__stream,local_5bc,&local_5e8->cad_data_size);
                    if (uVar3 != 0) {
                      pcVar9 = "cad data size";
                      uVar8 = 0x690;
                      goto LAB_001f4d7f;
                    }
                    if (local_5e8->cad_data != (REF_BYTE *)0x0) {
                      free(local_5e8->cad_data);
                    }
                    pRVar2 = local_5e8;
                    __size = local_5e8->cad_data_size;
                    __ptr = (REF_BYTE *)malloc(__size);
                    pRVar2->cad_data = __ptr;
                    if (__ptr == (REF_BYTE *)0x0) {
                      pcVar9 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
                      uVar8 = 0x696;
                      goto LAB_001f4c02;
                    }
                    sVar6 = fread(__ptr,1,__size,__stream);
                    if (__size == sVar6) {
                      sVar6 = ftello(__stream);
                      if (local_5f8 == sVar6) goto LAB_001f572c;
                      pcVar9 = "end location";
                      uVar8 = 0x69b;
                      __size = local_5f8;
                    }
                    else {
                      pcVar9 = "cad_data";
                      uVar8 = 0x69a;
                    }
LAB_001f4cd3:
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,uVar8,"ref_import_meshb",pcVar9,__size,sVar6);
                    return 1;
                  }
LAB_001f572c:
                  fclose(__stream);
                  return 0;
                }
                pcVar9 = "jump";
                uVar8 = 0x68c;
              }
              else {
                pcVar9 = "init glob";
                uVar8 = 0x647;
              }
            }
            else {
              pcVar9 = "jump";
              uVar8 = 0x62e;
            }
            goto LAB_001f4b35;
          }
          printf("dim %d not supported\n",(ulong)local_5c0);
          pcVar9 = "dim";
          uVar8 = 0x628;
        }
LAB_001f4c9f:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar8,"ref_import_meshb",pcVar9);
        return 1;
      }
      pcVar9 = "jump";
      uVar8 = 0x622;
    }
    else {
      pcVar9 = "create grid";
      uVar8 = 0x616;
    }
  }
  else {
    pcVar9 = "header";
    uVar8 = 0x613;
  }
LAB_001f4b35:
  uVar10 = (ulong)uVar3;
LAB_001f4b38:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar8,
         "ref_import_meshb",uVar10,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_import_meshb(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT keyword_code, nnode, node, new_node;
  REF_INT ncell, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER + 1]; /* everyone gets id in meshb */
  REF_INT new_cell;
  REF_INT n0, n1, n2, n3, n4, id, group, node_per;
  REF_INT geom_keyword, type, i, geom, ngeom;
  REF_DBL param[2];
  REF_INT cad_data_keyword;
  REF_BOOL verbose = REF_FALSE;

  if (verbose) printf("header %s\n", filename);
  RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
  if (verbose) printf("meshb version %d\n", version);

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);
  ref_geom = ref_grid_geom(ref_grid);

  if (verbose) printf("open %s\n", filename);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                            &next_position),
      "jump");
  RAS(available, "meshb missing dimension");
  REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
  if (verbose) printf("meshb dim %d\n", dim);
  if (dim < 2 || 3 < dim) {
    printf("dim %d not supported\n", dim);
    THROW("dim");
  }
  if (2 == dim) ref_grid_twod(ref_grid) = REF_TRUE;

  RSS(ref_import_meshb_jump(file, version, key_pos, 4, &available,
                            &next_position),
      "jump");
  RAS(available, "meshb missing vertex");
  RSS(ref_import_meshb_int(file, version, &nnode), "nnode");
  if (verbose) printf("nnode %d\n", nnode);

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    if (2 == dim) {
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 0, new_node))),
          "x");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 1, new_node))),
          "y");
      ref_node_xyz(ref_node, 2, new_node) = 0.0;
    } else {
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 0, new_node))),
          "x");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 1, new_node))),
          "y");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 2, new_node))),
          "z");
    }
    RSS(ref_import_meshb_int(file, version, &id), "nnode");
  }
  REIS(next_position, ftello(file), "end location");

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_meshb_keyword(ref_cell, &keyword_code), "kw");
    RSS(ref_import_meshb_jump(file, version, key_pos, keyword_code, &available,
                              &next_position),
        "jump");
    if (available) {
      node_per = ref_cell_node_per(ref_cell);
      RSS(ref_import_meshb_int(file, version, &ncell), "ncell");
      if (verbose) printf(" group %d ncell %d\n", group, ncell);
      for (cell = 0; cell < ncell; cell++) {
        for (node = 0; node < (1 + node_per); node++) {
          RSS(ref_import_meshb_int(file, version, &(nodes[node])), "c2n");
        }
        for (node = 0; node < node_per; node++) {
          nodes[node]--;
        }
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          nodes[0] = n0;
          nodes[3] = n1;
          nodes[4] = n2;
          nodes[1] = n3;
          nodes[2] = n4;
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add cell");
      }
      REIS(next_position, ftell(file), "cell inconsistent");
    }
  }

  each_ref_type(ref_geom, type) {
    geom_keyword = 40 + type;
    RSS(ref_import_meshb_jump(file, version, key_pos, geom_keyword, &available,
                              &next_position),
        "jump");
    if (available) {
      RSS(ref_import_meshb_int(file, version, &(ngeom)), "ngeom");
      if (verbose) printf("type %d ngeom %d\n", type, ngeom);

      for (geom = 0; geom < ngeom; geom++) {
        RSS(ref_import_meshb_int(file, version, &(node)), "node");
        RSS(ref_import_meshb_int(file, version, &(id)), "node");
        for (i = 0; i < type; i++)
          REIS(1, fread(&(param[i]), sizeof(double), 1, file), "param");
        node--;
        RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom");
        if (0 < type) {
          double double_gref;
          REF_INT new_geom;
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          RSS(ref_geom_find(ref_geom, node, type, id, &new_geom), "find");
          ref_geom_gref(ref_geom, new_geom) = (REF_INT)double_gref;
        }
      }
      REIS(next_position, ftello(file), "end location");
    }
  }

  cad_data_keyword = 126; /* GmfByteFlow */
  RSS(ref_import_meshb_jump(file, version, key_pos, cad_data_keyword,
                            &available, &next_position),
      "jump");
  if (available) {
    RSS(ref_import_meshb_size(file, version,
                              &(ref_geom_cad_data_size(ref_geom))),
        "cad data size");
    if (verbose)
      printf("cad_data %ld bytes\n", (long)ref_geom_cad_data_size(ref_geom));
    /* safe non-NULL free, if already allocated, to prevent memory leaks */
    ref_free(ref_geom_cad_data(ref_geom));
    ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                      ref_geom_cad_data_size(ref_geom), REF_BYTE);
    REIS(ref_geom_cad_data_size(ref_geom),
         fread(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
               ref_geom_cad_data_size(ref_geom), file),
         "cad_data");
    REIS(next_position, ftello(file), "end location");
  }

  fclose(file);

  return REF_SUCCESS;
}